

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  int iVar1;
  GCObject *pGVar2;
  int iVar3;
  bool local_92;
  bool local_91;
  TValue *local_90;
  TValue *local_88;
  TValue *local_80;
  TValue *local_78;
  TValue *local_70;
  TValue *local_68;
  TValue *local_60;
  TValue *local_58;
  bool local_41;
  GCObject *local_40;
  lua_Integer i2;
  lua_Integer i1;
  TValue *tm;
  TValue *t2_local;
  TValue *t1_local;
  lua_State *L_local;
  
  tm = t2;
  t2_local = t1;
  t1_local = (TValue *)L;
  if ((t1->tt_ & 0x3fU) != (t2->tt_ & 0x3fU)) {
    if (((t1->tt_ & 0xfU) != (t2->tt_ & 0xfU)) || ((t1->tt_ & 0xfU) != 3)) {
      return 0;
    }
    if (t1->tt_ == 0x13) {
      i2 = (t1->value_).i;
    }
    else {
      iVar3 = luaV_tointeger(t1,&i2,0);
      local_41 = false;
      if (iVar3 == 0) goto LAB_0012f820;
    }
    if (tm->tt_ == 0x13) {
      local_40 = (tm->value_).gc;
    }
    else {
      iVar3 = luaV_tointeger(tm,(lua_Integer *)&local_40,0);
      local_41 = false;
      if (iVar3 == 0) goto LAB_0012f820;
    }
    local_41 = (GCObject *)i2 == local_40;
LAB_0012f820:
    return (uint)local_41;
  }
  switch(t1->tt_ & 0x3f) {
  case 0:
    L_local._4_4_ = 1;
    break;
  case 1:
    L_local._4_4_ = (uint)((t1->value_).b == (t2->value_).b);
    break;
  case 2:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 3:
    L_local._4_4_ = (uint)((t1->value_).n == (t2->value_).n);
    break;
  case 4:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 5:
    if ((t1->value_).gc == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    if (*(long *)((t1->value_).f + 0x28) == 0) {
      local_78 = (TValue *)0x0;
    }
    else {
      if ((*(byte *)(*(long *)((t1->value_).f + 0x28) + 10) & 0x20) == 0) {
        local_80 = luaT_gettm(*(Table **)((t1->value_).f + 0x28),TM_EQ,L->l_G->tmname[5]);
      }
      else {
        local_80 = (TValue *)0x0;
      }
      local_78 = local_80;
    }
    i1 = (lua_Integer)local_78;
    if (local_78 == (TValue *)0x0) {
      if (*(long *)((tm->value_).f + 0x28) == 0) {
        local_88 = (TValue *)0x0;
      }
      else {
        if ((*(byte *)(*(long *)((tm->value_).f + 0x28) + 10) & 0x20) == 0) {
          local_90 = luaT_gettm(*(Table **)((tm->value_).f + 0x28),TM_EQ,
                                *(TString **)(*(long *)&t1_local[1].tt_ + 0x108));
        }
        else {
          local_90 = (TValue *)0x0;
        }
        local_88 = local_90;
      }
      i1 = (lua_Integer)local_88;
    }
    goto LAB_0012fb8f;
  default:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 7:
    if ((t1->value_).gc == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    if (*(long *)((t1->value_).f + 0x10) == 0) {
      local_58 = (TValue *)0x0;
    }
    else {
      if ((*(byte *)(*(long *)((t1->value_).f + 0x10) + 10) & 0x20) == 0) {
        local_60 = luaT_gettm(*(Table **)((t1->value_).f + 0x10),TM_EQ,L->l_G->tmname[5]);
      }
      else {
        local_60 = (TValue *)0x0;
      }
      local_58 = local_60;
    }
    i1 = (lua_Integer)local_58;
    if (local_58 == (TValue *)0x0) {
      if (*(long *)((tm->value_).f + 0x10) == 0) {
        local_68 = (TValue *)0x0;
      }
      else {
        if ((*(byte *)(*(long *)((tm->value_).f + 0x10) + 10) & 0x20) == 0) {
          local_70 = luaT_gettm(*(Table **)((tm->value_).f + 0x10),TM_EQ,
                                *(TString **)(*(long *)&t1_local[1].tt_ + 0x108));
        }
        else {
          local_70 = (TValue *)0x0;
        }
        local_68 = local_70;
      }
      i1 = (lua_Integer)local_68;
    }
LAB_0012fb8f:
    if (i1 == 0) {
      L_local._4_4_ = 0;
    }
    else {
      luaT_callTM((lua_State *)t1_local,(TValue *)i1,t2_local,tm,(TValue *)t1_local[1].value_.gc,1);
      pGVar2 = t1_local[1].value_.gc;
      iVar3._0_1_ = pGVar2->tt;
      iVar3._1_1_ = pGVar2->marked;
      iVar3._2_2_ = *(undefined2 *)&pGVar2->field_0xa;
      local_91 = true;
      if (iVar3 != 0) {
        pGVar2 = t1_local[1].value_.gc;
        iVar1._0_1_ = pGVar2->tt;
        iVar1._1_1_ = pGVar2->marked;
        iVar1._2_2_ = *(undefined2 *)&pGVar2->field_0xa;
        local_92 = false;
        if (iVar1 == 1) {
          local_92 = *(int *)&(t1_local[1].value_.gc)->next == 0;
        }
        local_91 = local_92;
      }
      L_local._4_4_ = (uint)((local_91 ^ 0xffU) & 1);
    }
    break;
  case 0x13:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 0x14:
    L_local._4_4_ = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    break;
  case 0x16:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
  }
  return L_local._4_4_;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttype(t1) != ttype(t2)) {  /* not the same variant? */
    if (ttnov(t1) != ttnov(t2) || ttnov(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      lua_Integer i1, i2;  /* compare them as integers */
      return (tointeger(t1, &i1) && tointeger(t2, &i2) && i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttype(t1)) {
    case LUA_TNIL: return 1;
    case LUA_TNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_TNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_TBOOLEAN: return bvalue(t1) == bvalue(t2);  /* true must be 1 !! */
    case LUA_TLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_TLCF: return fvalue(t1) == fvalue(t2);
    case LUA_TSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_TLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_TUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case LUA_TTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  luaT_callTM(L, tm, t1, t2, L->top, 1);  /* call TM */
  return !l_isfalse(L->top);
}